

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O2

int gdImageGrayScale(gdImagePtr src)

{
  uint uVar1;
  uint uVar2;
  int color;
  code *pcVar3;
  uint uVar4;
  uint uVar5;
  int r;
  int y;
  int x;
  
  if (src != (gdImagePtr)0x0) {
    if (src->trueColor == 0) {
      pcVar3 = gdImageGetPixel;
    }
    else {
      pcVar3 = gdImageGetTrueColorPixel;
    }
    for (y = 0; y < src->sy; y = y + 1) {
      for (x = 0; x < src->sx; x = x + 1) {
        uVar1 = (*pcVar3)(src,x,y);
        if (src->trueColor == 0) {
          uVar2 = src->red[(int)uVar1];
          uVar5 = src->green[(int)uVar1];
          uVar4 = src->blue[(int)uVar1];
          uVar1 = src->alpha[(int)uVar1];
        }
        else {
          uVar2 = uVar1 >> 0x10 & 0xff;
          uVar5 = uVar1 >> 8 & 0xff;
          uVar4 = uVar1 & 0xff;
          uVar1 = uVar1 >> 0x18 & 0x7f;
        }
        r = (int)((double)(int)uVar4 * 0.114 +
                 (double)(int)uVar2 * 0.299 + (double)(int)uVar5 * 0.587);
        color = gdImageColorAllocateAlpha(src,r,r,r,uVar1);
        if (color == -1) {
          color = gdImageColorClosestAlpha(src,r,r,r,uVar1);
        }
        gdImageSetPixel(src,x,y,color);
      }
    }
    return 1;
  }
  return 0;
}

Assistant:

BGD_DECLARE(int) gdImageGrayScale(gdImagePtr src)
{
	int x, y;
	int r,g,b,a;
	int new_pxl, pxl;
	FuncPtr f;

	if (src==NULL) {
		return 0;
	}

	f = GET_PIXEL_FUNCTION(src);

	for (y=0; y<src->sy; ++y) {
		for (x=0; x<src->sx; ++x) {
			pxl = f (src, x, y);
			r = gdImageRed(src, pxl);
			g = gdImageGreen(src, pxl);
			b = gdImageBlue(src, pxl);
			a = gdImageAlpha(src, pxl);
			r = g = b = (int) (.299 * r + .587 * g + .114 * b);

			new_pxl = gdImageColorAllocateAlpha(src, r, g, b, a);
			if (new_pxl == -1) {
				new_pxl = gdImageColorClosestAlpha(src, r, g, b, a);
			}
			gdImageSetPixel (src, x, y, new_pxl);
		}
	}
	return 1;
}